

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

void calc_sad_update_bestmv_with_indices
               (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,MV_COST_PARAMS *mv_cost_params,
               FULLPEL_MV *best_mv,FULLPEL_MV center_mv,uint8_t *center_address,uint *bestsad,
               uint *raw_bestsad,int search_step,int *best_site,int num_candidates,
               int *chkpts_indices,int *cost_list)

{
  buf_2d *pbVar1;
  buf_2d *pbVar2;
  search_site_config *psVar3;
  uint uVar4;
  FULLPEL_MV FVar5;
  short sVar6;
  ushort uVar7;
  int i;
  long lVar8;
  long lVar9;
  short sVar10;
  ushort uVar11;
  uint uVar12;
  ushort uVar13;
  long lVar14;
  short sVar15;
  short sVar16;
  undefined4 in_stack_00000024;
  
  lVar14 = CONCAT44(in_stack_00000024,num_candidates);
  pbVar1 = (ms_params->ms_buffers).ref;
  pbVar2 = (ms_params->ms_buffers).src;
  psVar3 = ms_params->search_sites;
  lVar8 = 0;
  do {
    lVar9 = (long)*(int *)(lVar14 + lVar8 * 4);
    sVar15 = psVar3->site[(uint)search_step][lVar9].mv.col + center_mv.col;
    if (((int)sVar15 < (ms_params->mv_limits).col_min) ||
       ((ms_params->mv_limits).col_max < (int)sVar15)) {
LAB_001dcf09:
      if (chkpts_indices != (int *)0x0) {
        chkpts_indices[lVar9 + 1] = 0x7fffffff;
      }
    }
    else {
      sVar16 = psVar3->site[(uint)search_step][lVar9].mv.row + center_mv.row;
      if (((int)sVar16 < (ms_params->mv_limits).row_min) ||
         ((ms_params->mv_limits).row_max < (int)sVar16)) goto LAB_001dcf09;
      uVar4 = (*ms_params->sdf)(pbVar2->buf,pbVar2->stride,
                                center_address + psVar3->site[(uint)search_step][lVar9].offset,
                                pbVar1->stride);
      if (chkpts_indices != (int *)0x0) {
        chkpts_indices[lVar9 + 1] = uVar4;
      }
      lVar14 = CONCAT44(in_stack_00000024,num_candidates);
      if (uVar4 < *bestsad) {
        if (mv_cost_params->mv_cost_type < 4) {
          sVar10 = sVar16 - (mv_cost_params->full_ref_mv).row;
          uVar11 = sVar10 * 8;
          sVar6 = sVar15 - (mv_cost_params->full_ref_mv).col;
          uVar7 = sVar6 * 8;
          switch(mv_cost_params->mv_cost_type) {
          case '\0':
            uVar12 = (mv_cost_params->mvcost[0][(short)uVar11] +
                      *(int *)((long)mv_cost_params->mvjcost +
                              (ulong)((uint)(uVar7 != 0) * 4 + (uint)(uVar11 != 0) * 8)) +
                     mv_cost_params->mvcost[1][(short)uVar7]) * mv_cost_params->sad_per_bit + 0x100U
                     >> 9;
            break;
          case '\x01':
            uVar13 = sVar10 * -8;
            if ((short)(sVar10 * -8) < 0) {
              uVar13 = uVar11;
            }
            uVar11 = sVar6 * -8;
            if ((short)(sVar6 * -8) < 0) {
              uVar11 = uVar7;
            }
            uVar12 = ((uint)uVar11 + (uint)uVar13) * 4;
            break;
          case '\x02':
            uVar13 = sVar10 * -8;
            if ((short)(sVar10 * -8) < 0) {
              uVar13 = uVar11;
            }
            uVar11 = sVar6 * -8;
            if ((short)(sVar6 * -8) < 0) {
              uVar11 = uVar7;
            }
            uVar12 = ((uint)uVar11 + (uint)uVar13) * 0xf >> 3;
            break;
          case '\x03':
            uVar13 = sVar10 * -8;
            if ((short)(sVar10 * -8) < 0) {
              uVar13 = uVar11;
            }
            uVar11 = sVar6 * -8;
            if ((short)(sVar6 * -8) < 0) {
              uVar11 = uVar7;
            }
            uVar12 = (uint)uVar11 + (uint)uVar13;
          }
        }
        else {
          uVar12 = 0;
        }
        lVar14 = CONCAT44(in_stack_00000024,num_candidates);
        if (uVar12 + uVar4 < *bestsad) {
          if (raw_bestsad != (uint *)0x0) {
            *raw_bestsad = uVar4;
          }
          FVar5.col = sVar15;
          FVar5.row = sVar16;
          *bestsad = uVar12 + uVar4;
          *best_mv = FVar5;
          *best_site = (int)lVar8;
        }
      }
    }
    lVar8 = lVar8 + 1;
    if (lVar8 == 3) {
      return;
    }
  } while( true );
}

Assistant:

static inline void calc_sad_update_bestmv_with_indices(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
    const MV_COST_PARAMS *mv_cost_params, FULLPEL_MV *best_mv,
    const FULLPEL_MV center_mv, const uint8_t *center_address,
    unsigned int *bestsad, unsigned int *raw_bestsad, int search_step,
    int *best_site, const int num_candidates, const int *chkpts_indices,
    int *cost_list) {
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site *site = ms_params->search_sites->site[search_step];
  // Loop over number of candidates.
  for (int i = 0; i < num_candidates; i++) {
    int index = chkpts_indices[i];
    const FULLPEL_MV this_mv = { center_mv.row + site[index].mv.row,
                                 center_mv.col + site[index].mv.col };
    if (!av1_is_fullmv_in_range(&ms_params->mv_limits, this_mv)) {
      if (cost_list) {
        cost_list[index + 1] = INT_MAX;
      }
      continue;
    }
    const int thissad = get_mvpred_sad(
        ms_params, src, center_address + site[index].offset, ref->stride);
    if (cost_list) {
      cost_list[index + 1] = thissad;
    }
    const int found_better_mv = update_mvs_and_sad(
        thissad, &this_mv, mv_cost_params, bestsad, raw_bestsad, best_mv,
        /*second_best_mv=*/NULL);
    if (found_better_mv) *best_site = i;
  }
}